

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP4Reader::Init(BP4Reader *this)

{
  float fVar1;
  float fVar2;
  IO *pIVar3;
  _func_int *p_Var4;
  long lVar5;
  pointer pcVar6;
  pointer pcVar7;
  Seconds timeoutSeconds;
  TimePoint timeoutInstant;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->super_Engine).m_OpenMode != Read) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Engine","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"BP4Reader","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Init","");
    std::operator+(&local_48,"BPFileReader only supports OpenMode::Read from",
                   &(this->super_Engine).m_Name);
    helper::Throw<std::invalid_argument>(&local_e8,&local_a8,&local_c8,&local_48,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  pIVar3 = (this->super_Engine).m_IO;
  pIVar3->m_ReadStreaming = false;
  p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"in call to BP4::Open to write","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  adios2::format::BPBase::Init
            ((BPBase *)(p_Var4 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),
             &pIVar3->m_Parameters,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (*(this->super_Engine)._vptr_Engine[0x17])(this);
  helper::RaiseLimitNoFile();
  if (this->readMetadataFromFile == true) {
    p_Var4 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
    fVar1 = *(float *)(p_Var4 + 0x224 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    pcVar7 = (pointer)(double)fVar1;
    fVar2 = *(float *)(p_Var4 + 0x228 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer);
    pcVar6 = pcVar7;
    if (fVar2 <= fVar1) {
      pcVar6 = (pointer)(double)fVar2;
    }
    local_e8._M_dataplus._M_p = pcVar7;
    local_a8._M_dataplus._M_p = pcVar6;
    lVar5 = std::chrono::_V2::steady_clock::now();
    local_c8._M_dataplus._M_p = (pointer)((double)pcVar7 * 1000000000.0 + (double)lVar5);
    OpenFiles(this,(TimePoint *)&local_c8,(Seconds *)&local_a8,(Seconds *)&local_e8);
    if (((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x268)
        [(long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer] == (_func_int)0x0) {
      local_48._M_dataplus._M_p = (pointer)(pcVar6 / 10.0);
      InitBuffer(this,(TimePoint *)&local_c8,(Seconds *)&local_48,(Seconds *)&local_e8);
    }
  }
  return;
}

Assistant:

void BP4Reader::Init()
{
    if (m_OpenMode != Mode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "Init",
                                             "BPFileReader only "
                                             "supports OpenMode::Read from" +
                                                 m_Name);
    }
    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;

    m_BP4Deserializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    InitTransports();

    helper::RaiseLimitNoFile();
    if (readMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds(m_BP4Deserializer.m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds(m_BP4Deserializer.m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;

        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        if (!m_BP4Deserializer.m_Parameters.StreamReader)
        {
            /* non-stream reader gets as much steps as available now */
            InitBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        }
    }
}